

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spdlog-inl.h
# Opt level: O0

void spdlog::set_default_logger(shared_ptr<spdlog::logger> *default_logger)

{
  shared_ptr<spdlog::logger> *in_RDI;
  shared_ptr<spdlog::logger> *in_stack_00000008;
  registry *in_stack_00000010;
  shared_ptr<spdlog::logger> *in_stack_ffffffffffffffb8;
  
  details::registry::instance();
  std::shared_ptr<spdlog::logger>::shared_ptr(in_RDI,in_stack_ffffffffffffffb8);
  details::registry::set_default_logger(in_stack_00000010,in_stack_00000008);
  std::shared_ptr<spdlog::logger>::~shared_ptr((shared_ptr<spdlog::logger> *)0x1a1aa7);
  return;
}

Assistant:

SPDLOG_INLINE void set_default_logger(std::shared_ptr<spdlog::logger> default_logger)
{
    details::registry::instance().set_default_logger(std::move(default_logger));
}